

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

lytype_plugin_list * lytype_find(char *module,char *revision,char *type_name)

{
  char *s2;
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (type_plugins_count != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      iVar1 = ly_strequal_(module,*(char **)((long)&type_plugins->module + lVar2));
      if (iVar1 != 0) {
        s2 = *(char **)((long)&type_plugins->revision + lVar2);
        if (revision == (char *)0x0) {
          if (s2 == (char *)0x0) goto LAB_001708e0;
        }
        else {
          iVar1 = ly_strequal_(revision,s2);
          if (iVar1 != 0) {
LAB_001708e0:
            iVar1 = ly_strequal_(type_name,*(char **)((long)&type_plugins->name + lVar2));
            if (iVar1 != 0) {
              return (lytype_plugin_list *)((long)&type_plugins->module + lVar2);
            }
          }
        }
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar3 < type_plugins_count);
  }
  return (lytype_plugin_list *)0x0;
}

Assistant:

static struct lytype_plugin_list *
lytype_find(const char *module, const char *revision, const char *type_name)
{
    uint16_t u;

    for (u = 0; u < type_plugins_count; ++u) {
        if (ly_strequal(module, type_plugins[u].module, 0) && ((!revision && !type_plugins[u].revision)
                || (revision && ly_strequal(revision, type_plugins[u].revision, 0)))
                && ly_strequal(type_name, type_plugins[u].name, 0)) {
            return &(type_plugins[u]);
        }
    }

    return NULL;
}